

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O0

void Commands::Mute(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Command_Source *from,bool announce)

{
  Command_Source *from_00;
  int iVar1;
  undefined4 extraout_var;
  const_reference pvVar2;
  Character *victim_00;
  _Mem_fn<void_(World::*)(Command_Source_*,_Character_*,_bool)> local_88;
  function<void_(World_*,_Command_Source_*,_Character_*,_bool)> local_78;
  string local_48;
  Character *local_28;
  Character *victim;
  Command_Source *pCStack_18;
  bool announce_local;
  Command_Source *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  victim._7_1_ = announce;
  pCStack_18 = from;
  from_local = (Command_Source *)arguments;
  iVar1 = (*from->_vptr_Command_Source[4])();
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)from_local,0);
  std::__cxx11::string::string((string *)&local_48,(string *)pvVar2);
  victim_00 = World::GetCharacter((World *)CONCAT44(extraout_var,iVar1),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  from_00 = pCStack_18;
  local_28 = victim_00;
  local_88.super__Mem_fn_base<void_(World::*)(Command_Source_*,_Character_*,_bool),_true>._M_pmf =
       (offset_in_World_to_subr)
       std::mem_fn<void(Command_Source*,Character*,bool),World>
                 ((_Mem_fn<void_(World::*)(Command_Source_*,_Character_*,_bool)> *)World::Mute,0);
  std::function<void(World*,Command_Source*,Character*,bool)>::
  function<std::_Mem_fn<void(World::*)(Command_Source*,Character*,bool)>,void>
            ((function<void(World*,Command_Source*,Character*,bool)> *)&local_78,&local_88);
  do_punishment(from_00,victim_00,&local_78,(bool)(victim._7_1_ & 1));
  std::function<void_(World_*,_Command_Source_*,_Character_*,_bool)>::~function(&local_78);
  return;
}

Assistant:

void Mute(const std::vector<std::string>& arguments, Command_Source* from, bool announce = true)
{
	Character* victim = from->SourceWorld()->GetCharacter(arguments[0]);
	do_punishment(from, victim, std::mem_fn(&World::Mute), announce);
}